

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O1

void sf_unescape(sf_vec *dest,sf_vec *src)

{
  size_t sVar1;
  void *pvVar2;
  size_t __n;
  uint8_t *__s;
  size_t __n_00;
  uint8_t *puVar3;
  uint8_t *__dest;
  
  __n_00 = src->len;
  if (__n_00 == 0) {
    sVar1 = src->len;
    dest->base = src->base;
    dest->len = sVar1;
  }
  else {
    __dest = dest->base;
    __s = src->base;
    pvVar2 = memchr(__s,0x5c,__n_00);
    while (pvVar2 != (void *)0x0) {
      __n = (long)pvVar2 - (long)__s;
      memcpy(__dest,__s,__n);
      __s = (uint8_t *)((long)pvVar2 + 2);
      puVar3 = __dest + __n;
      __dest = puVar3 + 1;
      *puVar3 = *(uint8_t *)((long)pvVar2 + 1);
      __n_00 = (__n_00 - __n) - 2;
      pvVar2 = memchr(__s,0x5c,__n_00);
    }
    if (__n_00 == src->len) {
      sVar1 = src->len;
      dest->base = src->base;
      dest->len = sVar1;
    }
    else {
      memcpy(__dest,__s,__n_00);
      dest->len = (size_t)(__dest + (__n_00 - (long)dest->base));
    }
  }
  return;
}

Assistant:

void sf_unescape(sf_vec *dest, const sf_vec *src) {
  const uint8_t *p, *q;
  uint8_t *o;
  size_t len, slen;

  if (src->len == 0) {
    *dest = *src;

    return;
  }

  o = dest->base;
  p = src->base;
  len = src->len;

  for (;;) {
    q = memchr(p, '\\', len);
    if (q == NULL) {
      if (len == src->len) {
        *dest = *src;

        return;
      }

      memcpy(o, p, len);
      o += len;

      break;
    }

    slen = (size_t)(q - p);
    memcpy(o, p, slen);
    o += slen;

    p = q + 1;
    *o++ = *p++;
    len -= slen + 2;
  }

  dest->len = (size_t)(o - dest->base);
}